

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O2

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  undefined1 *puVar1;
  byte *pbVar2;
  byte bVar3;
  connectdata *conn;
  char cVar4;
  int iVar5;
  CURLcode CVar6;
  uint uVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  curl_slist *pcVar11;
  curl_slist *pcVar12;
  curl_slist *list;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  uchar *input;
  uchar *data_00;
  uchar *data_01;
  uchar *key;
  size_t datalen;
  curl_slist *l;
  char *pcVar16;
  curl_slist **ppcVar17;
  size_t *psVar18;
  uint uVar19;
  byte *pbVar20;
  ulong uVar22;
  pair *__base;
  uint uVar23;
  char *tmp;
  long lVar24;
  size_t sVar25;
  bool bVar26;
  bool bVar27;
  size_t len;
  CURLcode local_88c;
  char *local_880;
  char *local_878;
  size_t local_870;
  Curl_HttpReq httpreq;
  char timestamp [17];
  char *method;
  uchar sign0 [32];
  char service [65];
  uchar sign1 [32];
  char region [65];
  char provider0 [65];
  char date_hdr_key [72];
  char provider1 [65];
  dynbuf canonical_query;
  dynbuf signed_headers;
  uchar sha_hash [32];
  dynbuf canonical_headers;
  time_t clock;
  char sha_hex [65];
  char date_full_hdr [90];
  char content_sha256_hdr [151];
  tm tm;
  pair array [64];
  byte *pbVar21;
  
  conn = data->conn;
  provider0[0x40] = '\0';
  provider0[0x30] = '\0';
  provider0[0x31] = '\0';
  provider0[0x32] = '\0';
  provider0[0x33] = '\0';
  provider0[0x34] = '\0';
  provider0[0x35] = '\0';
  provider0[0x36] = '\0';
  provider0[0x37] = '\0';
  provider0[0x38] = '\0';
  provider0[0x39] = '\0';
  provider0[0x3a] = '\0';
  provider0[0x3b] = '\0';
  provider0[0x3c] = '\0';
  provider0[0x3d] = '\0';
  provider0[0x3e] = '\0';
  provider0[0x3f] = '\0';
  provider0[0x20] = '\0';
  provider0[0x21] = '\0';
  provider0[0x22] = '\0';
  provider0[0x23] = '\0';
  provider0[0x24] = '\0';
  provider0[0x25] = '\0';
  provider0[0x26] = '\0';
  provider0[0x27] = '\0';
  provider0[0x28] = '\0';
  provider0[0x29] = '\0';
  provider0[0x2a] = '\0';
  provider0[0x2b] = '\0';
  provider0[0x2c] = '\0';
  provider0[0x2d] = '\0';
  provider0[0x2e] = '\0';
  provider0[0x2f] = '\0';
  provider0[0x10] = '\0';
  provider0[0x11] = '\0';
  provider0[0x12] = '\0';
  provider0[0x13] = '\0';
  provider0[0x14] = '\0';
  provider0[0x15] = '\0';
  provider0[0x16] = '\0';
  provider0[0x17] = '\0';
  provider0[0x18] = '\0';
  provider0[0x19] = '\0';
  provider0[0x1a] = '\0';
  provider0[0x1b] = '\0';
  provider0[0x1c] = '\0';
  provider0[0x1d] = '\0';
  provider0[0x1e] = '\0';
  provider0[0x1f] = '\0';
  provider0[0] = '\0';
  provider0[1] = '\0';
  provider0[2] = '\0';
  provider0[3] = '\0';
  provider0[4] = '\0';
  provider0[5] = '\0';
  provider0[6] = '\0';
  provider0[7] = '\0';
  provider0[8] = '\0';
  provider0[9] = '\0';
  provider0[10] = '\0';
  provider0[0xb] = '\0';
  provider0[0xc] = '\0';
  provider0[0xd] = '\0';
  provider0[0xe] = '\0';
  provider0[0xf] = '\0';
  provider1[0x40] = '\0';
  provider1[0x30] = '\0';
  provider1[0x31] = '\0';
  provider1[0x32] = '\0';
  provider1[0x33] = '\0';
  provider1[0x34] = '\0';
  provider1[0x35] = '\0';
  provider1[0x36] = '\0';
  provider1[0x37] = '\0';
  provider1[0x38] = '\0';
  provider1[0x39] = '\0';
  provider1[0x3a] = '\0';
  provider1[0x3b] = '\0';
  provider1[0x3c] = '\0';
  provider1[0x3d] = '\0';
  provider1[0x3e] = '\0';
  provider1[0x3f] = '\0';
  provider1[0x20] = '\0';
  provider1[0x21] = '\0';
  provider1[0x22] = '\0';
  provider1[0x23] = '\0';
  provider1[0x24] = '\0';
  provider1[0x25] = '\0';
  provider1[0x26] = '\0';
  provider1[0x27] = '\0';
  provider1[0x28] = '\0';
  provider1[0x29] = '\0';
  provider1[0x2a] = '\0';
  provider1[0x2b] = '\0';
  provider1[0x2c] = '\0';
  provider1[0x2d] = '\0';
  provider1[0x2e] = '\0';
  provider1[0x2f] = '\0';
  provider1[0x10] = '\0';
  provider1[0x11] = '\0';
  provider1[0x12] = '\0';
  provider1[0x13] = '\0';
  provider1[0x14] = '\0';
  provider1[0x15] = '\0';
  provider1[0x16] = '\0';
  provider1[0x17] = '\0';
  provider1[0x18] = '\0';
  provider1[0x19] = '\0';
  provider1[0x1a] = '\0';
  provider1[0x1b] = '\0';
  provider1[0x1c] = '\0';
  provider1[0x1d] = '\0';
  provider1[0x1e] = '\0';
  provider1[0x1f] = '\0';
  provider1[0] = '\0';
  provider1[1] = '\0';
  provider1[2] = '\0';
  provider1[3] = '\0';
  provider1[4] = '\0';
  provider1[5] = '\0';
  provider1[6] = '\0';
  provider1[7] = '\0';
  provider1[8] = '\0';
  provider1[9] = '\0';
  provider1[10] = '\0';
  provider1[0xb] = '\0';
  provider1[0xc] = '\0';
  provider1[0xd] = '\0';
  provider1[0xe] = '\0';
  provider1[0xf] = '\0';
  region[0x40] = '\0';
  region[0x30] = '\0';
  region[0x31] = '\0';
  region[0x32] = '\0';
  region[0x33] = '\0';
  region[0x34] = '\0';
  region[0x35] = '\0';
  region[0x36] = '\0';
  region[0x37] = '\0';
  region[0x38] = '\0';
  region[0x39] = '\0';
  region[0x3a] = '\0';
  region[0x3b] = '\0';
  region[0x3c] = '\0';
  region[0x3d] = '\0';
  region[0x3e] = '\0';
  region[0x3f] = '\0';
  region[0x20] = '\0';
  region[0x21] = '\0';
  region[0x22] = '\0';
  region[0x23] = '\0';
  region[0x24] = '\0';
  region[0x25] = '\0';
  region[0x26] = '\0';
  region[0x27] = '\0';
  region[0x28] = '\0';
  region[0x29] = '\0';
  region[0x2a] = '\0';
  region[0x2b] = '\0';
  region[0x2c] = '\0';
  region[0x2d] = '\0';
  region[0x2e] = '\0';
  region[0x2f] = '\0';
  region[0x10] = '\0';
  region[0x11] = '\0';
  region[0x12] = '\0';
  region[0x13] = '\0';
  region[0x14] = '\0';
  region[0x15] = '\0';
  region[0x16] = '\0';
  region[0x17] = '\0';
  region[0x18] = '\0';
  region[0x19] = '\0';
  region[0x1a] = '\0';
  region[0x1b] = '\0';
  region[0x1c] = '\0';
  region[0x1d] = '\0';
  region[0x1e] = '\0';
  region[0x1f] = '\0';
  region[0] = '\0';
  region[1] = '\0';
  region[2] = '\0';
  region[3] = '\0';
  region[4] = '\0';
  region[5] = '\0';
  region[6] = '\0';
  region[7] = '\0';
  region[8] = '\0';
  region[9] = '\0';
  region[10] = '\0';
  region[0xb] = '\0';
  region[0xc] = '\0';
  region[0xd] = '\0';
  region[0xe] = '\0';
  region[0xf] = '\0';
  service[0x40] = '\0';
  service[0x30] = '\0';
  service[0x31] = '\0';
  service[0x32] = '\0';
  service[0x33] = '\0';
  service[0x34] = '\0';
  service[0x35] = '\0';
  service[0x36] = '\0';
  service[0x37] = '\0';
  service[0x38] = '\0';
  service[0x39] = '\0';
  service[0x3a] = '\0';
  service[0x3b] = '\0';
  service[0x3c] = '\0';
  service[0x3d] = '\0';
  service[0x3e] = '\0';
  service[0x3f] = '\0';
  service[0x20] = '\0';
  service[0x21] = '\0';
  service[0x22] = '\0';
  service[0x23] = '\0';
  service[0x24] = '\0';
  service[0x25] = '\0';
  service[0x26] = '\0';
  service[0x27] = '\0';
  service[0x28] = '\0';
  service[0x29] = '\0';
  service[0x2a] = '\0';
  service[0x2b] = '\0';
  service[0x2c] = '\0';
  service[0x2d] = '\0';
  service[0x2e] = '\0';
  service[0x2f] = '\0';
  service[0x10] = '\0';
  service[0x11] = '\0';
  service[0x12] = '\0';
  service[0x13] = '\0';
  service[0x14] = '\0';
  service[0x15] = '\0';
  service[0x16] = '\0';
  service[0x17] = '\0';
  service[0x18] = '\0';
  service[0x19] = '\0';
  service[0x1a] = '\0';
  service[0x1b] = '\0';
  service[0x1c] = '\0';
  service[0x1d] = '\0';
  service[0x1e] = '\0';
  service[0x1f] = '\0';
  service[0] = '\0';
  service[1] = '\0';
  service[2] = '\0';
  service[3] = '\0';
  service[4] = '\0';
  service[5] = '\0';
  service[6] = '\0';
  service[7] = '\0';
  service[8] = '\0';
  service[9] = '\0';
  service[10] = '\0';
  service[0xb] = '\0';
  service[0xc] = '\0';
  service[0xd] = '\0';
  service[0xe] = '\0';
  service[0xf] = '\0';
  pcVar13 = (conn->host).name;
  method = (char *)0x0;
  memset(content_sha256_hdr,0,0x97);
  pcVar16 = (data->state).aptr.user;
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "";
  }
  sign0[0x10] = '\0';
  sign0[0x11] = '\0';
  sign0[0x12] = '\0';
  sign0[0x13] = '\0';
  sign0[0x14] = '\0';
  sign0[0x15] = '\0';
  sign0[0x16] = '\0';
  sign0[0x17] = '\0';
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  sign0[0] = '\0';
  sign0[1] = '\0';
  sign0[2] = '\0';
  sign0[3] = '\0';
  sign0[4] = '\0';
  sign0[5] = '\0';
  sign0[6] = '\0';
  sign0[7] = '\0';
  sign0[8] = '\0';
  sign0[9] = '\0';
  sign0[10] = '\0';
  sign0[0xb] = '\0';
  sign0[0xc] = '\0';
  sign0[0xd] = '\0';
  sign0[0xe] = '\0';
  sign0[0xf] = '\0';
  sign1[0x10] = '\0';
  sign1[0x11] = '\0';
  sign1[0x12] = '\0';
  sign1[0x13] = '\0';
  sign1[0x14] = '\0';
  sign1[0x15] = '\0';
  sign1[0x16] = '\0';
  sign1[0x17] = '\0';
  sign1[0x18] = '\0';
  sign1[0x19] = '\0';
  sign1[0x1a] = '\0';
  sign1[0x1b] = '\0';
  sign1[0x1c] = '\0';
  sign1[0x1d] = '\0';
  sign1[0x1e] = '\0';
  sign1[0x1f] = '\0';
  sign1[0] = '\0';
  sign1[1] = '\0';
  sign1[2] = '\0';
  sign1[3] = '\0';
  sign1[4] = '\0';
  sign1[5] = '\0';
  sign1[6] = '\0';
  sign1[7] = '\0';
  sign1[8] = '\0';
  sign1[9] = '\0';
  sign1[10] = '\0';
  sign1[0xb] = '\0';
  sign1[0xc] = '\0';
  sign1[0xd] = '\0';
  sign1[0xe] = '\0';
  sign1[0xf] = '\0';
  pcVar8 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar8 != (char *)0x0) {
    return CURLE_OK;
  }
  local_878 = "";
  Curl_dyn_init(&canonical_headers,0x19000);
  Curl_dyn_init(&canonical_query,0x19000);
  Curl_dyn_init(&signed_headers,0x19000);
  pcVar8 = (data->set).str[0x4c];
  pcVar10 = "aws:amz";
  if (pcVar8 != (char *)0x0) {
    pcVar10 = pcVar8;
  }
  __isoc99_sscanf(pcVar10,"%64[^:]:%64[^:]:%64[^:]:%64s",provider0,provider1,region,service);
  if (provider0[0] == '\0') {
    local_880 = (char *)0x0;
    Curl_failf(data,"first aws-sigv4 provider can\'t be empty");
    local_88c = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_005076e4;
  }
  if (provider1[0] == '\0') {
    strcpy(provider1,provider0);
  }
  if (service[0] != '\0') goto LAB_00507543;
  pcVar8 = strchr(pcVar13,0x2e);
  if (pcVar8 == (char *)0x0) {
    pcVar13 = "aws-sigv4: service missing in parameters and hostname";
LAB_005076cf:
    local_88c = CURLE_URL_MALFORMAT;
    local_880 = (char *)0x0;
    Curl_failf(data,pcVar13);
    goto LAB_005076e4;
  }
  uVar22 = (long)pcVar8 - (long)pcVar13;
  if (0x40 < uVar22) {
    pcVar13 = "aws-sigv4: service too long in hostname";
    goto LAB_005076cf;
  }
  memcpy(service,pcVar13,uVar22);
  service[uVar22] = '\0';
  if (((data->set).field_0x8bd & 0x10) != 0) {
    Curl_infof(data,"aws_sigv4: picked service %s from host",service);
  }
  if (region[0] == '\0') {
    pcVar8 = pcVar8 + 1;
    pcVar10 = strchr(pcVar8,0x2e);
    if (pcVar10 == (char *)0x0) {
      pcVar13 = "aws-sigv4: region missing in parameters and hostname";
    }
    else {
      uVar22 = (long)pcVar10 - (long)pcVar8;
      if (uVar22 < 0x41) {
        memcpy(region,pcVar8,uVar22);
        region[uVar22] = '\0';
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"aws_sigv4: picked region %s from host",region);
        }
        goto LAB_00507543;
      }
      pcVar13 = "aws-sigv4: region too long in hostname";
    }
    goto LAB_005076cf;
  }
LAB_00507543:
  local_88c = CURLE_URL_MALFORMAT;
  Curl_http_method(data,conn,&method,&httpreq);
  iVar5 = curl_strequal(provider0,"aws");
  if (iVar5 == 0) {
    bVar26 = false;
  }
  else {
    iVar5 = curl_strequal(service,"s3");
    bVar26 = iVar5 != 0;
  }
  iVar5 = curl_msnprintf((char *)array,0x52,"x-%s-content-sha256",provider1);
  pcVar8 = Curl_checkheaders(data,(char *)array,(long)iVar5);
  if ((pcVar8 == (char *)0x0) || (pcVar8 = strchr(pcVar8,0x3a), pcVar8 == (char *)0x0)) {
    if (bVar26) {
      bVar26 = true;
      if ((httpreq != HTTPREQ_GET) && (httpreq != HTTPREQ_HEAD)) {
        bVar26 = (data->set).filesize == 0;
      }
      if (httpreq == HTTPREQ_POST) {
        bVar27 = (data->set).postfields != (void *)0x0;
      }
      else {
        bVar27 = false;
      }
      if ((bool)(bVar26 | bVar27)) {
        CVar6 = calc_payload_hash(data,sha_hash,sha_hex);
        if (CVar6 != CURLE_OK) goto LAB_0050781d;
      }
      else {
        builtin_strncpy(sha_hex,"UNSIGNED-PAYLOAD",0x11);
      }
      curl_msnprintf(content_sha256_hdr,0x95,"x-%s-content-sha256: %s",provider1,sha_hex);
LAB_005077e0:
      pcVar8 = sha_hex;
      local_870 = strlen(pcVar8);
      goto LAB_005077f5;
    }
    CVar6 = calc_payload_hash(data,sha_hash,sha_hex);
    if (CVar6 == CURLE_OK) goto LAB_005077e0;
LAB_0050781d:
    local_880 = (char *)0x0;
LAB_00507834:
    key = (uchar *)0x0;
    pcVar13 = (char *)0x0;
    data_00 = (uchar *)0x0;
    data_01 = (uchar *)0x0;
    input = (uchar *)0x0;
    local_88c = CVar6;
    goto LAB_00507838;
  }
  do {
    do {
      pcVar10 = pcVar8;
      pcVar8 = pcVar10 + 1;
    } while (*pcVar8 == ' ');
  } while (*pcVar8 == '\t');
  sVar9 = strlen(pcVar8);
  do {
    local_870 = sVar9;
    if (local_870 == 0) break;
    cVar4 = pcVar10[local_870];
    sVar9 = local_870 - 1;
  } while ((cVar4 == ' ') || (cVar4 == '\t'));
LAB_005077f5:
  time(&clock);
  CVar6 = Curl_gmtime(clock,&tm);
  if (CVar6 != CURLE_OK) goto LAB_0050781d;
  sVar9 = strftime(timestamp,0x11,"%Y%m%dT%H%M%SZ",(tm *)&tm);
  if (sVar9 == 0) {
    local_880 = (char *)0x0;
    input = (uchar *)0x0;
    data_00 = (uchar *)0x0;
    pcVar13 = (char *)0x0;
    data_01 = (uchar *)0x0;
    key = (uchar *)0x0;
    local_88c = CURLE_OUT_OF_MEMORY;
    goto LAB_00507838;
  }
  sVar9 = strlen(provider1);
  Curl_strntolower(provider1,provider1,sVar9);
  cVar4 = Curl_raw_toupper(provider1[0]);
  provider1[0] = cVar4;
  curl_msnprintf(date_hdr_key,0x48,"X-%s-Date",provider1);
  Curl_strntolower(provider1,provider1,1);
  curl_msnprintf(date_full_hdr,0x5a,"x-%s-date:%s",provider1,timestamp);
  pcVar10 = Curl_checkheaders(data,"Host",4);
  if (pcVar10 == (char *)0x0) {
    pcVar10 = (data->state).aptr.host;
    if (pcVar10 == (char *)0x0) {
      sVar9 = strlen(pcVar13);
      if (0xff < sVar9) goto LAB_00507bbb;
      curl_msnprintf((char *)array,0x105,"host:%s",pcVar13);
LAB_00507dd6:
      list = curl_slist_append((curl_slist *)0x0,(char *)array);
      if (list != (curl_slist *)0x0) goto LAB_00507957;
      CVar6 = CURLE_OUT_OF_MEMORY;
    }
    else {
      sVar9 = strlen(pcVar10);
      if (sVar9 < 0x106) {
        strcpy((char *)array,pcVar10);
        sVar9 = strcspn((char *)array,"\n\r");
        *(undefined1 *)((long)&array[0].p + sVar9) = 0;
        goto LAB_00507dd6;
      }
LAB_00507bbb:
      CVar6 = CURLE_URL_MALFORMAT;
    }
    local_880 = (char *)0x0;
    list = (curl_slist *)0x0;
  }
  else {
    list = (curl_slist *)0x0;
LAB_00507957:
    pcVar11 = list;
    if ((content_sha256_hdr[0] == '\0') ||
       (pcVar11 = curl_slist_append(list,content_sha256_hdr), pcVar11 != (curl_slist *)0x0)) {
      ppcVar17 = &(data->set).headers;
      list = pcVar11;
      while (pcVar11 = *ppcVar17, pcVar12 = list, pcVar11 != (curl_slist *)0x0) {
        pcVar13 = pcVar11->data;
        pcVar10 = strchr(pcVar13,0x3a);
        if (((pcVar10 != (char *)0x0) || (pcVar10 = strchr(pcVar13,0x3b), pcVar10 != (char *)0x0))
           && ((*pcVar10 != ':' || (pcVar10[1] != '\0')))) {
          lVar24 = 0;
          while (((cVar4 = pcVar10[lVar24 + 1], cVar4 == '\t' || (cVar4 == ' ')) ||
                 ((byte)(cVar4 - 10U) < 4))) {
            lVar24 = lVar24 + 1;
          }
          if ((lVar24 == 0) || (cVar4 != '\0')) {
            pcVar13 = (*Curl_cstrdup)(pcVar13);
            if (pcVar13 != (char *)0x0) {
              pcVar13[(long)pcVar10 - (long)pcVar11->data] = ':';
              pcVar12 = Curl_slist_append_nodup(list,pcVar13);
              if (pcVar12 != (curl_slist *)0x0) goto LAB_00507ac0;
              (*Curl_cfree)(pcVar13);
            }
            local_880 = (char *)0x0;
            goto LAB_00507db0;
          }
        }
LAB_00507ac0:
        list = pcVar12;
        ppcVar17 = &pcVar11->next;
      }
      for (; pcVar12 != (curl_slist *)0x0; pcVar12 = pcVar12->next) {
        pcVar13 = pcVar12->data;
        sVar9 = strcspn(pcVar13,":");
        Curl_strntolower(pcVar13,pcVar13,sVar9);
        if (pcVar12->data[sVar9] != '\0') {
          pcVar10 = pcVar12->data + sVar9 + 1;
          for (pcVar13 = pcVar10; (cVar4 = *pcVar13, cVar4 == '\t' || (cVar4 == ' '));
              pcVar13 = pcVar13 + 1) {
          }
LAB_00507b2d:
          if (cVar4 != '\0') {
            iVar5 = 0;
            pcVar14 = pcVar13;
            while ((pcVar13 = pcVar14 + 1, cVar4 == ' ' || (cVar4 == '\t'))) {
              iVar5 = iVar5 + -1;
              pcVar14 = pcVar13;
              cVar4 = *pcVar13;
            }
            if (iVar5 != 0) goto code_r0x00507b53;
            goto LAB_00507b65;
          }
          *pcVar10 = '\0';
        }
      }
      sVar9 = strlen(date_hdr_key);
      pcVar13 = Curl_checkheaders(data,date_hdr_key,sVar9);
      if ((pcVar13 == (char *)0x0) &&
         (pcVar13 = Curl_checkheaders(data,"Date",4), pcVar13 == (char *)0x0)) {
        pcVar11 = curl_slist_append(list,date_full_hdr);
        if (pcVar11 == (curl_slist *)0x0) {
LAB_00507e4e:
          CVar6 = CURLE_OUT_OF_MEMORY;
          local_880 = (char *)0x0;
          goto LAB_00507e57;
        }
        local_880 = curl_maprintf("%s: %s\r\n",date_hdr_key,timestamp);
        list = pcVar11;
      }
      else {
        pbVar20 = (byte *)strchr(pcVar13,0x3a);
        if (pbVar20 == (byte *)0x0) goto LAB_00507e4e;
        do {
          do {
            pbVar21 = pbVar20;
            pbVar20 = pbVar21 + 1;
            bVar3 = *pbVar20;
          } while (bVar3 == 9);
        } while (bVar3 == 0x20);
        lVar24 = 2;
        while ((bVar3 != 0 &&
               (((byte)(bVar3 - 0x30) < 10 || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a))))) {
          pbVar2 = pbVar21 + lVar24;
          lVar24 = lVar24 + 1;
          bVar3 = *pbVar2;
        }
        if (lVar24 == 0x12) {
          timestamp._0_8_ = *(undefined8 *)pbVar20;
          timestamp._8_8_ = *(undefined8 *)(pbVar21 + 9);
          timestamp[0x10] = '\0';
        }
        else {
          timestamp._0_8_ = timestamp._0_8_ & 0xffffffffffffff00;
        }
        local_880 = (char *)0x0;
      }
      pcVar11 = list;
      bVar26 = false;
      do {
        while (bVar27 = bVar26, pcVar12 = pcVar11, pcVar12 != (curl_slist *)0x0) {
          pcVar11 = pcVar12->next;
          bVar26 = bVar27;
          if (pcVar11 != (curl_slist *)0x0) {
            pcVar13 = pcVar12->data;
            pcVar10 = pcVar11->data;
            iVar5 = strcmp(pcVar13,pcVar10);
            if (0 < iVar5) {
              pcVar12->data = pcVar10;
              pcVar11->data = pcVar13;
              bVar26 = true;
            }
          }
        }
        pcVar11 = list;
        bVar26 = false;
      } while (bVar27);
      for (; pcVar11 != (curl_slist *)0x0; pcVar11 = pcVar11->next) {
        CVar6 = Curl_dyn_add(&canonical_headers,pcVar11->data);
        if ((CVar6 != CURLE_OK) ||
           (CVar6 = Curl_dyn_add(&canonical_headers,"\n"), CVar6 != CURLE_OK)) goto LAB_00507db0;
        pcVar13 = strchr(pcVar11->data,0x3a);
        if (pcVar13 != (char *)0x0) {
          *pcVar13 = '\0';
        }
        if (((pcVar11 != list) && (CVar6 = Curl_dyn_add(&signed_headers,";"), CVar6 != CURLE_OK)) ||
           (CVar6 = Curl_dyn_add(&signed_headers,pcVar11->data), CVar6 != CURLE_OK))
        goto LAB_00507db0;
      }
      CVar6 = CURLE_OK;
    }
    else {
      CVar6 = CURLE_OUT_OF_MEMORY;
      local_880 = (char *)0x0;
    }
  }
LAB_00507e57:
  __base = array;
  curl_slist_free_all(list);
  if (CVar6 != CURLE_OK) {
    input = (uchar *)0x0;
    data_00 = (uchar *)0x0;
    pcVar13 = (char *)0x0;
    data_01 = (uchar *)0x0;
    key = (uchar *)0x0;
    local_88c = CVar6;
    goto LAB_00507838;
  }
  if (content_sha256_hdr[0] != '\0') {
    sVar9 = strlen(content_sha256_hdr);
    (content_sha256_hdr + sVar9)[0] = '\r';
    (content_sha256_hdr + sVar9)[1] = '\n';
    content_sha256_hdr[sVar9 + 2] = '\0';
  }
  date_full_hdr[0] = timestamp[0];
  date_full_hdr[1] = timestamp[1];
  date_full_hdr[2] = timestamp[2];
  date_full_hdr[3] = timestamp[3];
  date_full_hdr[4] = timestamp[4];
  date_full_hdr[5] = timestamp[5];
  date_full_hdr[6] = timestamp[6];
  date_full_hdr[7] = timestamp[7];
  date_full_hdr[8] = '\0';
  pcVar13 = (data->state).up.query;
  if (pcVar13 != (char *)0x0) {
    psVar18 = &array[0].len;
    lVar24 = 0;
LAB_00507ed3:
    ((pair *)(psVar18 + -1))->p = pcVar13;
    pcVar10 = strchr(pcVar13,0x26);
    if (pcVar10 != (char *)0x0) goto code_r0x00507ee7;
    sVar9 = strlen(pcVar13);
    *psVar18 = sVar9;
    uVar23 = (uint)lVar24;
    if (uVar23 != 0x3f) {
      qsort(__base,lVar24 + 1,0x10,compare_func);
      local_88c = CURLE_OK;
      for (uVar19 = 0; (local_88c == CURLE_OK && (uVar19 <= uVar23)); uVar19 = uVar19 + 1) {
        sVar25 = __base->len;
        if (sVar25 == 0) {
          local_88c = CURLE_OK;
        }
        else {
          pbVar20 = (byte *)__base->p;
          local_88c = CURLE_OK;
          bVar26 = false;
          while ((sVar25 != 0 && (local_88c == CURLE_OK))) {
            bVar3 = *pbVar20;
            pbVar21 = pbVar20;
            if (((byte)(bVar3 - 0x30) < 10) ||
               (((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a || (bVar3 - 0x2d < 2)))) {
LAB_00507fdb:
              len = 1;
              pcVar13 = (char *)pbVar20;
LAB_00507fe3:
              local_88c = Curl_dyn_addn(&canonical_query,pcVar13,len);
            }
            else if (bVar3 == 0x25) {
              if (((9 < (byte)(pbVar20[1] - 0x30)) &&
                  ((uVar7 = pbVar20[1] - 0x41, 0x25 < uVar7 ||
                   ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) ||
                 ((9 < (byte)(pbVar20[2] - 0x30) &&
                  ((uVar7 = pbVar20[2] - 0x41, 0x25 < uVar7 ||
                   ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))))) {
                pcVar13 = "%25";
LAB_00508111:
                len = 3;
                goto LAB_00507fe3;
              }
              pbVar21 = pbVar20 + 2;
              date_hdr_key[2] = '\0';
              date_hdr_key[0] = '%';
              date_hdr_key[1] = '\0';
              cVar4 = Curl_raw_toupper(pbVar20[1]);
              date_hdr_key[1] = cVar4;
              date_hdr_key[2] = Curl_raw_toupper(pbVar20[2]);
              local_88c = Curl_dyn_addn(&canonical_query,date_hdr_key,3);
              sVar25 = sVar25 - 2;
            }
            else {
              if (bVar3 != 0x3d) {
                if ((bVar3 != 0x7e) && (bVar3 != 0x5f)) {
                  date_hdr_key[1] = "0123456789ABCDEF"[*pbVar20 >> 4];
                  date_hdr_key[0] = '%';
                  date_hdr_key[2] = "0123456789ABCDEF"[*pbVar20 & 0xf];
                  pcVar13 = date_hdr_key;
                  goto LAB_00508111;
                }
                goto LAB_00507fdb;
              }
              local_88c = Curl_dyn_addn(&canonical_query,pbVar20,1);
              bVar26 = true;
            }
            pbVar20 = pbVar21 + 1;
            sVar25 = sVar25 - 1;
          }
          if ((local_88c == CURLE_OK) &&
             ((bVar26 || (local_88c = Curl_dyn_addn(&canonical_query,"=",1), local_88c == CURLE_OK))
             )) {
            if (uVar19 < uVar23) {
              local_88c = Curl_dyn_addn(&canonical_query,"&",1);
            }
            else {
              local_88c = CURLE_OK;
            }
          }
        }
        __base = __base + 1;
      }
      if (local_88c == CURLE_OK) goto LAB_00508187;
      goto LAB_005076e4;
    }
    goto LAB_00507f16;
  }
LAB_00508187:
  pcVar10 = method;
  pcVar13 = (data->state).up.path;
  pcVar14 = Curl_dyn_ptr(&canonical_query);
  if (pcVar14 != (char *)0x0) {
    local_878 = Curl_dyn_ptr(&canonical_query);
  }
  pcVar14 = Curl_dyn_ptr(&canonical_headers);
  pcVar15 = Curl_dyn_ptr(&signed_headers);
  input = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%.*s",pcVar10,pcVar13,local_878,pcVar14,
                                 pcVar15,local_870,pcVar8);
  if (input == (uchar *)0x0) {
    CVar6 = CURLE_OUT_OF_MEMORY;
    goto LAB_00507834;
  }
  sVar9 = strlen(provider0);
  Curl_strntolower(provider0,provider0,sVar9);
  data_00 = (uchar *)curl_maprintf("%s4_request",provider0);
  if (data_00 == (uchar *)0x0) {
    data_00 = (uchar *)0x0;
LAB_005082f8:
    local_88c = CURLE_OUT_OF_MEMORY;
    key = (uchar *)0x0;
    pcVar13 = (char *)0x0;
    data_01 = (uchar *)0x0;
    goto LAB_00507838;
  }
  pcVar13 = curl_maprintf("%s/%s/%s/%s",date_full_hdr,region,service,data_00);
  if (pcVar13 == (char *)0x0) goto LAB_005082f8;
  sVar9 = strlen((char *)input);
  CVar6 = Curl_sha256it(sha_hash,input,sVar9);
  if (CVar6 != CURLE_OK) {
    data_01 = (uchar *)0x0;
LAB_005082a9:
    key = (uchar *)0x0;
    local_88c = CURLE_OUT_OF_MEMORY;
    goto LAB_00507838;
  }
  sha256_to_hex(sha_hex,sha_hash);
  sVar9 = strlen(provider0);
  Curl_strntoupper(provider0,provider0,sVar9);
  data_01 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",provider0,timestamp,pcVar13,sha_hex
                                  );
  if (data_01 != (uchar *)0x0) {
    pcVar8 = (data->state).aptr.passwd;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "";
    }
    key = (uchar *)curl_maprintf("%s4%s",provider0,pcVar8);
    if (key != (uchar *)0x0) {
      sVar9 = strlen((char *)key);
      datalen = strlen(date_full_hdr);
      local_88c = Curl_hmacit(Curl_HMAC_SHA256,key,sVar9,(uchar *)date_full_hdr,datalen,sign0);
      if (local_88c == CURLE_OK) {
        sVar9 = strlen(region);
        local_88c = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,(uchar *)region,sVar9,sign1);
        if (local_88c == CURLE_OK) {
          sVar9 = strlen(service);
          local_88c = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,(uchar *)service,sVar9,sign0);
          if (local_88c == CURLE_OK) {
            sVar9 = strlen((char *)data_00);
            local_88c = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,data_00,sVar9,sign1);
            if (local_88c == CURLE_OK) {
              sVar9 = strlen((char *)data_01);
              local_88c = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,data_01,sVar9,sign0);
              if (local_88c == CURLE_OK) {
                sha256_to_hex(sha_hex,sign0);
                pcVar10 = Curl_dyn_ptr(&signed_headers);
                pcVar8 = "";
                if (local_880 != (char *)0x0) {
                  pcVar8 = local_880;
                }
                local_88c = CURLE_OK;
                pcVar16 = curl_maprintf("Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s%s"
                                        ,provider0,pcVar16,pcVar13,pcVar10,sha_hex,pcVar8,
                                        content_sha256_hdr);
                if (pcVar16 != (char *)0x0) {
                  (*Curl_cfree)((data->state).aptr.userpwd);
                  (data->state).aptr.userpwd = pcVar16;
                  puVar1 = &(data->state).authhost.field_0x18;
                  *puVar1 = *puVar1 | 1;
                }
              }
            }
          }
        }
      }
      goto LAB_00507838;
    }
    goto LAB_005082a9;
  }
  local_88c = CURLE_OUT_OF_MEMORY;
LAB_005076ed:
  data_01 = (uchar *)0x0;
  key = (uchar *)0x0;
LAB_00507838:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  (*Curl_cfree)(input);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(pcVar13);
  (*Curl_cfree)(data_01);
  (*Curl_cfree)(key);
  (*Curl_cfree)(local_880);
  return local_88c;
code_r0x00507b53:
  bVar26 = cVar4 != '\0';
  cVar4 = '\0';
  pcVar13 = pcVar14;
  if (bVar26) {
    cVar4 = ' ';
LAB_00507b65:
    *pcVar10 = cVar4;
    pcVar10 = pcVar10 + 1;
    cVar4 = *pcVar13;
  }
  goto LAB_00507b2d;
LAB_00507db0:
  CVar6 = CURLE_OUT_OF_MEMORY;
  goto LAB_00507e57;
code_r0x00507ee7:
  *psVar18 = (long)pcVar10 - (long)pcVar13;
  pcVar13 = pcVar10 + 1;
  lVar24 = lVar24 + 1;
  psVar18 = psVar18 + 2;
  if ((int)lVar24 == 0x40) goto LAB_00507f16;
  goto LAB_00507ed3;
LAB_00507f16:
  Curl_failf(data,"aws-sigv4: too many query pairs in URL");
LAB_005076e4:
  input = (uchar *)0x0;
  data_00 = (uchar *)0x0;
  pcVar13 = (char *)0x0;
  goto LAB_005076ed;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode result = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  bool sign_as_s3 = false;
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  struct dynbuf canonical_query;
  char *date_header = NULL;
  Curl_HttpReq httpreq;
  const char *method = NULL;
  char *payload_hash = NULL;
  size_t payload_hash_len = 0;
  unsigned char sha_hash[SHA256_DIGEST_LENGTH];
  char sha_hex[SHA256_HEX_LENGTH];
  char content_sha256_hdr[CONTENT_SHA256_HDR_LEN + 2] = ""; /* add \r\n */
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[SHA256_DIGEST_LENGTH] = {0};
  unsigned char sign1[SHA256_DIGEST_LENGTH] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init those buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_query, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
  */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first aws-sigv4 provider can't be empty");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "aws-sigv4: service missing in parameters and hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "aws-sigv4: service too long in hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    memcpy(service, hostname, len);
    service[len] = '\0';

    infof(data, "aws_sigv4: picked service %s from host", service);

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "aws-sigv4: region missing in parameters and hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "aws-sigv4: region too long in hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      memcpy(region, reg, len);
      region[len] = '\0';
      infof(data, "aws_sigv4: picked region %s from host", region);
    }
  }

  Curl_http_method(data, conn, &method, &httpreq);

  /* AWS S3 requires a x-amz-content-sha256 header, and supports special
   * values like UNSIGNED-PAYLOAD */
  sign_as_s3 = (strcasecompare(provider0, "aws") &&
                strcasecompare(service, "s3"));

  payload_hash = parse_content_sha_hdr(data, provider1, &payload_hash_len);

  if(!payload_hash) {
    if(sign_as_s3)
      result = calc_s3_payload_hash(data, httpreq, provider1, sha_hash,
                                    sha_hex, content_sha256_hdr);
    else
      result = calc_payload_hash(data, sha_hash, sha_hex);
    if(result)
      goto fail;

    payload_hash = sha_hex;
    /* may be shorter than SHA256_HEX_LENGTH, like S3_UNSIGNED_PAYLOAD */
    payload_hash_len = strlen(sha_hex);
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      time(&clock);
  }
#else
  time(&clock);
#endif
  result = Curl_gmtime(clock, &tm);
  if(result) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = make_headers(data, hostname, timestamp, provider1,
                        &date_header, content_sha256_hdr,
                        &canonical_headers, &signed_headers);
  if(result)
    goto fail;

  if(*content_sha256_hdr) {
    /* make_headers() needed this without the \r\n for canonicalization */
    size_t hdrlen = strlen(content_sha256_hdr);
    DEBUGASSERT(hdrlen + 3 < sizeof(content_sha256_hdr));
    memcpy(content_sha256_hdr + hdrlen, "\r\n", 3);
  }

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  result = canon_query(data, data->state.up.query, &canonical_query);
  if(result)
    goto fail;
  result = CURLE_OUT_OF_MEMORY;

  canonical_request =
    curl_maprintf("%s\n" /* HTTPRequestMethod */
                  "%s\n" /* CanonicalURI */
                  "%s\n" /* CanonicalQueryString */
                  "%s\n" /* CanonicalHeaders */
                  "%s\n" /* SignedHeaders */
                  "%.*s",  /* HashedRequestPayload in hex */
                  method,
                  data->state.up.path,
                  Curl_dyn_ptr(&canonical_query) ?
                  Curl_dyn_ptr(&canonical_query) : "",
                  Curl_dyn_ptr(&canonical_headers),
                  Curl_dyn_ptr(&signed_headers),
                  (int)payload_hash_len, payload_hash);
  if(!canonical_request)
    goto fail;

  DEBUGF(infof(data, "Canonical request: %s", canonical_request));

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = curl_maprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = curl_maprintf("%s/%s/%s/%s",
                                   date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash);

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we only support HMAC.
   */
  str_to_sign = curl_maprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                              "%s\n" /* RequestDateTime */
                              "%s\n" /* CredentialScope */
                              "%s",  /* HashedCanonicalRequest in hex */
                              provider0,
                              timestamp,
                              credential_scope,
                              sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = curl_maprintf("%s4%s", provider0,
                         data->state.aptr.passwd ?
                         data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0);

  /* provider 0 uppercase */
  auth_headers = curl_maprintf("Authorization: %s4-HMAC-SHA256 "
                               "Credential=%s/%s, "
                               "SignedHeaders=%s, "
                               "Signature=%s\r\n"
                               /*
                                * date_header is added here, only if it wasn't
                                * user-specified (using CURLOPT_HTTPHEADER).
                                * date_header includes \r\n
                                */
                               "%s"
                               "%s", /* optional sha256 header includes \r\n */
                               provider0,
                               user,
                               credential_scope,
                               Curl_dyn_ptr(&signed_headers),
                               sha_hex,
                               date_header ? date_header : "",
                               content_sha256_hdr);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  result = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return result;
}